

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

void Abc_ConvertHopToGia_rec2(Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                  ,0x3c,"void Abc_ConvertHopToGia_rec2(Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 != 0)) {
    pHVar2 = Hop_ObjFanin0(pObj);
    Abc_ConvertHopToGia_rec2(pHVar2);
    pHVar2 = Hop_ObjFanin1(pObj);
    Abc_ConvertHopToGia_rec2(pHVar2);
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 == 0) {
      __assert_fail("Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                    ,0x41,"void Abc_ConvertHopToGia_rec2(Hop_Obj_t *)");
    }
    Hop_ObjClearMarkA(pObj);
  }
  return;
}

Assistant:

void Abc_ConvertHopToGia_rec2( Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertHopToGia_rec2( Hop_ObjFanin0(pObj) ); 
    Abc_ConvertHopToGia_rec2( Hop_ObjFanin1(pObj) );
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
}